

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int ffcalc_rng(fitsfile *infptr,char *expr,fitsfile *outfptr,char *parName,char *parInfo,int nRngs,
              long *start,long *end,int *status)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ushort **ppuVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  anon_union_256_9_9da4f342_for_data *comm;
  LONGLONG value;
  fitsfile *fptr;
  ulong uVar12;
  int colNo;
  fitsfile *local_290;
  char tform [16];
  long nelem;
  uint local_264;
  int naxis;
  char nullKwd [9];
  long totaln;
  int typecode;
  long width;
  long repeat;
  long naxes [5];
  ParseData lParse;
  parseInfo Info;
  char card [81];
  
  if (*status != 0) {
    return *status;
  }
  local_264 = nRngs;
  memset(&Info,0,0x90);
  iVar5 = ffiprs(infptr,0,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  lVar9 = nelem;
  if (iVar5 != 0) {
    ffcprs(&lParse);
    return *status;
  }
  if (nelem < 0) {
    nelem = -nelem;
  }
  colNo = 0;
  local_290 = infptr;
  Info.parseData = &lParse;
  ffpmrk();
  ffgcno(outfptr,0,parName,&colNo,status);
  ffcmsg();
  pcVar10 = parInfo;
  if (*status == 0) {
    ffkeyn("TDIM",colNo,tform,status);
    ffgcrd(outfptr,tform,card,status);
    if (*status == 0xca) {
      *status = 0;
      ffcmsg();
      fptr = local_290;
      if (1 < naxis) goto LAB_0011ca1c;
    }
    else {
      fptr = local_290;
      if (*status == 0) {
LAB_0011ca1c:
        fptr = local_290;
        ffptdm(outfptr,colNo,naxis,naxes,status);
      }
    }
    if (*status != 0) {
      ffcprs(&lParse);
      return *status;
    }
    bVar3 = true;
  }
  else {
    *status = 0;
    if (*parName == '#') {
      if (-1 < lVar9) {
        ffcprs(&lParse);
        pcVar10 = "Cannot put tabular result into keyword (ffcalc)";
LAB_0011cc72:
        ffpmsg(pcVar10);
        *status = 0x1b0;
        return 0x1b0;
      }
      parName = parName + 1;
      iVar5 = fits_strcasecmp(parName,"HISTORY");
      if (((iVar5 == 0) || (iVar5 = fits_strcasecmp(parName,"COMMENT"), iVar5 == 0)) &&
         (Info.datatype != 0x10)) {
        ffcprs(&lParse);
        pcVar10 = "HISTORY and COMMENT values must be strings (ffcalc)";
        goto LAB_0011cc72;
      }
    }
    else if (lVar9 < 0) {
      iVar5 = ffgcrd(outfptr,parName,card,status);
      if (iVar5 == 0xca) {
        colNo = -1;
      }
      else if (*status != 0) {
        ffcprs(&lParse);
        return *status;
      }
    }
    else {
      colNo = -1;
    }
    bVar3 = true;
    fptr = local_290;
    if (colNo < 0) {
      *status = 0;
      ffgncl(outfptr,&colNo,status);
      colNo = colNo + 1;
      if (parInfo == (char *)0x0) {
LAB_0011cbe6:
        if (lParse.hdutype == 2) {
          snprintf(tform,0xf,"%ld",nelem);
          pcVar10 = tform;
          if (Info.datatype < 0x29) {
            if (Info.datatype == 1) {
              pcVar10 = tform;
              sVar8 = strlen(pcVar10);
              (tform + sVar8)[0] = 'X';
              (tform + sVar8)[1] = '\0';
            }
            else if (Info.datatype == 0xe) {
              pcVar10 = tform;
              sVar8 = strlen(pcVar10);
              (tform + sVar8)[0] = 'L';
              (tform + sVar8)[1] = '\0';
            }
            else if (Info.datatype == 0x10) {
              sVar8 = strlen(tform);
              (tform + sVar8)[0] = 'A';
              (tform + sVar8)[1] = '\0';
              pcVar10 = tform;
            }
          }
          else if (Info.datatype == 0x29) {
            pcVar10 = tform;
            sVar8 = strlen(pcVar10);
            (tform + sVar8)[0] = 'J';
            (tform + sVar8)[1] = '\0';
          }
          else if (Info.datatype == 0x51) {
            pcVar10 = tform;
            sVar8 = strlen(pcVar10);
            (tform + sVar8)[0] = 'K';
            (tform + sVar8)[1] = '\0';
          }
          else if (Info.datatype == 0x52) {
            sVar8 = strlen(tform);
            (tform + sVar8)[0] = 'D';
            (tform + sVar8)[1] = '\0';
            pcVar10 = tform;
          }
        }
        else {
          pcVar10 = tform;
          if (Info.datatype < 0x10) {
            if (Info.datatype == 1) goto LAB_0011cd47;
            if (Info.datatype == 0xe) {
              ffcprs(&lParse);
              ffpmsg("Cannot create LOGICAL column in ASCII table");
              *status = 0xe3;
              return 0xe3;
            }
          }
          else if (Info.datatype == 0x10) {
LAB_0011cd47:
            snprintf(pcVar10,0x10,"A%ld",nelem);
          }
          else if (Info.datatype == 0x29) {
            builtin_strncpy(tform,"I11",4);
          }
          else if (Info.datatype == 0x52) {
            builtin_strncpy(tform,"D23.15",7);
          }
        }
      }
      else {
        cVar1 = *parInfo;
        if ((long)cVar1 == 0) goto LAB_0011cbe6;
        ppuVar7 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 8) == 0) && (lParse.hdutype == 2)) {
          if ((cVar1 == 'B') && (Info.datatype == 1)) {
            lVar9 = nelem + 0xe;
            if (-1 < nelem + 7) {
              lVar9 = nelem + 7;
            }
            nelem = lVar9 >> 3;
          }
          pcVar10 = tform;
          snprintf(pcVar10,0x10,"%ld%s",nelem,parInfo);
        }
      }
      fficol(outfptr,colNo,parName,pcVar10,status);
      if (1 < naxis) {
        ffptdm(outfptr,colNo,naxis,naxes,status);
      }
      ffkeyn("TNULL",colNo,nullKwd,status);
      iVar5 = ffgcrd(outfptr,nullKwd,card,status);
      fptr = local_290;
      if (iVar5 == 0xca) {
        *status = 0;
        if (lParse.hdutype == 1) {
          ffpkys(outfptr,nullKwd,"NULL","Null value string",status);
          ffsnul(outfptr,colNo,"NULL",status);
          bVar3 = false;
          fptr = local_290;
        }
        else if (lParse.hdutype == 2) {
          ffbnfm(pcVar10,&typecode,&repeat,&width,status);
          if (typecode < 0x1f) {
            if (typecode == 0xb) {
              value = 0xff;
            }
            else {
              if (typecode != 0x15) goto LAB_0011d1e5;
              value = -0x8000;
            }
LAB_0011cef2:
            bVar3 = false;
          }
          else {
            if ((typecode == 0x1f) || (typecode == 0x29)) {
              value = -0x80000000;
              goto LAB_0011cef2;
            }
            if (typecode == 0x51) {
              value = -0x8000000000000000;
              goto LAB_0011cef2;
            }
LAB_0011d1e5:
            bVar3 = true;
            value = 0;
          }
          fptr = local_290;
          if (!bVar3) {
            ffpkyj(outfptr,nullKwd,value,"Null value",status);
            fftnul(outfptr,colNo,value,status);
            fptr = local_290;
          }
        }
      }
    }
  }
  if (colNo < 1) {
    if (Info.datatype < 0x10) {
      if (Info.datatype != 1) {
        if (Info.datatype == 0xe) {
          ffukyl(outfptr,parName,(int)lParse.Nodes[lParse.resultNode].value.data.log,pcVar10,status)
          ;
        }
        goto LAB_0011d125;
      }
    }
    else if (Info.datatype != 0x10) {
      if (Info.datatype == 0x29) {
        ffukyj(outfptr,parName,lParse.Nodes[lParse.resultNode].value.data.lng,pcVar10,status);
      }
      else if (Info.datatype == 0x52) {
        ffukyd(outfptr,parName,lParse.Nodes[lParse.resultNode].value.data.dbl,0xf,pcVar10,status);
      }
      goto LAB_0011d125;
    }
    iVar5 = fits_strcasecmp(parName,"HISTORY");
    if (iVar5 == 0) {
      ffphis(outfptr,&lParse.Nodes[lParse.resultNode].value.data.log,status);
    }
    else {
      iVar5 = fits_strcasecmp(parName,"COMMENT");
      comm = &lParse.Nodes[lParse.resultNode].value.data;
      if (iVar5 == 0) {
        ffpcom(outfptr,&comm->log,status);
      }
      else {
        ffukys(outfptr,parName,&comm->log,pcVar10,status);
      }
    }
  }
  else {
    ffgkyj(fptr,"NAXIS2",&totaln,(char *)0x0,status);
    iVar5 = lParse.nCols;
    iVar6 = fits_parser_allocateCol(&lParse,lParse.nCols,status);
    if (iVar6 == 0) {
      bVar4 = false;
      iVar5 = fits_iter_set_by_num(lParse.colData + iVar5,outfptr,colNo,0,2);
      lParse.nCols = lParse.nCols + 1;
      if (0 < (int)local_264) {
        uVar12 = (ulong)local_264;
        uVar11 = 0;
        do {
          Info.dataPtr = (void *)0x0;
          lVar9 = end[uVar11] - start[uVar11];
          Info.maxRows = lVar9 + 1;
          if ((((local_264 == 1) && (8 < lVar9)) && (*start == 1)) && (*end == totaln)) {
            lVar9 = 0;
          }
          else {
            lVar9 = (long)(int)Info.maxRows;
          }
          iVar5 = ffiter(lParse.nCols,lParse.colData,start[uVar11] + -1,lVar9,fits_parser_workfn,
                         &Info,status);
          if (iVar5 == -1) {
            *status = 0;
          }
          else if (*status != 0) goto LAB_0011cf69;
          iVar5 = 1;
          if (Info.anyNull != 0) {
            bVar4 = true;
          }
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      bVar2 = true;
      if (!bVar3 && !bVar4) {
        iVar5 = ffdkey(outfptr,nullKwd,status);
      }
    }
    else {
LAB_0011cf69:
      ffcprs(&lParse);
      iVar5 = *status;
      bVar2 = false;
    }
    if (!bVar2) {
      return iVar5;
    }
  }
LAB_0011d125:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int ffcalc_rng( fitsfile *infptr,   /* I - Input FITS file                  */
                char     *expr,     /* I - Arithmetic expression            */
                fitsfile *outfptr,  /* I - Output fits file                 */
                char     *parName,  /* I - Name of output parameter         */
                char     *parInfo,  /* I - Extra information on parameter   */
                int      nRngs,     /* I - Row range info                   */
                long     *start,    /* I - Row range info                   */
                long     *end,      /* I - Row range info                   */
                int      *status )  /* O - Error status                     */
/*                                                                          */
/* Evaluate an expression using the data in the input FITS file and place   */
/* the results into either a column or keyword in the output fits file,     */
/* depending on the value of parName (keywords normally prefixed with '#')  */
/* and whether the expression evaluates to a constant or a table column.    */
/* The logic is as follows:                                                 */
/*    (1) If a column exists with name, parName, put results there.         */
/*    (2) If parName starts with '#', as in #NAXIS, put result there,       */
/*        with parInfo used as the comment. If expression does not evaluate */
/*        to a constant, flag an error.                                     */
/*    (3) If a keyword exists with name, parName, and expression is a       */
/*        constant, put result there, using parInfo as the new comment.     */
/*    (4) Else, create a new column with name parName and TFORM parInfo.    */
/*        If parInfo is NULL, use a default data type for the column.       */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   Info.parseData = &lParse;
   /*  Case (1): If column exists put it there  */

   colNo = 0;
   ffpmrk(); /* prevent lack of column name from sullying the stack */
   ffgcno( outfptr, CASEINSEN, parName, &colNo, status );
   ffcmsg();   
   if( *status ) {

      /*  Output column doesn't exist.  Test for keyword. */

      /* Case (2): Does parName indicate result should be put into keyword */

      *status = 0;
      if( parName[0]=='#' ) {
         if( ! constant ) {
            ffcprs(&lParse);
            ffpmsg( "Cannot put tabular result into keyword (ffcalc)" );
            return( *status = PARSE_BAD_TYPE );
         }
         parName++;  /* Advance past '#' */
	 if ( (fits_strcasecmp(parName,"HISTORY") == 0 || fits_strcasecmp(parName,"COMMENT") == 0) &&
	      Info.datatype != TSTRING ) {
            ffcprs(&lParse);
            ffpmsg( "HISTORY and COMMENT values must be strings (ffcalc)" );
	    return( *status = PARSE_BAD_TYPE );
	 }

      } else if( constant ) {

         /* Case (3): Does a keyword named parName already exist */

         if( ffgcrd( outfptr, parName, card, status )==KEY_NO_EXIST ) {
            colNo = -1;
         } else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }

      } else
         colNo = -1;

      if( colNo<0 ) {

         /* Case (4): Create new column */

         *status = 0;
         ffgncl( outfptr, &colNo, status );
         colNo++;
         if( parInfo==NULL || *parInfo=='\0' ) {
            /*  Figure out best default column type  */
            if( lParse.hdutype==BINARY_TBL ) {
               snprintf(tform,15,"%ld",nelem);
               switch( Info.datatype ) {
               case TLOGICAL:  strcat(tform,"L");  break;
               case TLONG:     strcat(tform,"J");  break;
               case TDOUBLE:   strcat(tform,"D");  break;
               case TSTRING:   strcat(tform,"A");  break;
               case TBIT:      strcat(tform,"X");  break;
               case TLONGLONG: strcat(tform,"K");  break;
               }
            } else {
               switch( Info.datatype ) {
               case TLOGICAL:
                  ffcprs(&lParse);
                  ffpmsg("Cannot create LOGICAL column in ASCII table");
                  return( *status = NOT_BTABLE );
               case TLONG:     strcpy(tform,"I11");     break;
               case TDOUBLE:   strcpy(tform,"D23.15");  break;
               case TSTRING:   
               case TBIT:      snprintf(tform,16,"A%ld",nelem);  break;
               }
            }
            parInfo = tform;
         } else if( !(isdigit((int) *parInfo)) && lParse.hdutype==BINARY_TBL ) {
            if( Info.datatype==TBIT && *parInfo=='B' )
               nelem = (nelem+7)/8;
            snprintf(tform,16,"%ld%s",nelem,parInfo);
            parInfo = tform;
         }
         fficol( outfptr, colNo, parName, parInfo, status );
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );

         /*  Setup TNULLn keyword in case NULLs are encountered  */

         ffkeyn("TNULL", colNo, nullKwd, status);
         if( ffgcrd( outfptr, nullKwd, card, status )==KEY_NO_EXIST ) {
            *status = 0;
            if( lParse.hdutype==BINARY_TBL ) {
	       LONGLONG nullVal=0;
               fits_binary_tform( parInfo, &typecode, &repeat, &width, status );
               if( typecode==TBYTE )
                  nullVal = UCHAR_MAX;
               else if( typecode==TSHORT )
                  nullVal = SHRT_MIN;
               else if( typecode==TINT )
                  nullVal = INT_MIN;
               else if( typecode==TLONG ) {
                  if (sizeof(long) == 8 && sizeof(int) == 4)
                     nullVal = INT_MIN;
                  else
                     nullVal = LONG_MIN;
               }
               else if( typecode==TLONGLONG )
                  nullVal = LONGLONG_MIN;
		  
               if( nullVal ) {
                  ffpkyj( outfptr, nullKwd, nullVal, "Null value", status );
                  fits_set_btblnull( outfptr, colNo, nullVal, status );
                  newNullKwd = 1;
               }
            } else if( lParse.hdutype==ASCII_TBL ) {
               ffpkys( outfptr, nullKwd, "NULL", "Null value string", status );
               fits_set_atblnull( outfptr, colNo, "NULL", status );
               newNullKwd = 1;
            }
         }

      }

   } else if( *status ) {
      ffcprs(&lParse);
      return( *status );
   } else {

      /********************************************************/
      /*  Check if a TDIM keyword should be written/updated.  */
      /********************************************************/

      ffkeyn("TDIM", colNo, tdimKwd, status);
      ffgcrd( outfptr, tdimKwd, card, status );
      if( *status==0 ) {
         /*  TDIM exists, so update it with result's dimension  */
         ffptdm( outfptr, colNo, naxis, naxes, status );
      } else if( *status==KEY_NO_EXIST ) {
         /*  TDIM does not exist, so clear error stack and     */
         /*  write a TDIM only if result is multi-dimensional  */
         *status = 0;
         ffcmsg();
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );
      }
      if( *status ) {
         /*  Either some other error happened in ffgcrd   */
         /*  or one happened in ffptdm                    */
         ffcprs(&lParse);
         return( *status );
      }

   }

   if( colNo>0 ) {

      /*  Output column exists (now)... put results into it  */

      int anyNull = 0;
      int nPerLp, i;
      long totaln;

      ffgkyj(infptr, "NAXIS2", &totaln, 0, status);

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/

      col_cnt = lParse.nCols;
      if( fits_parser_allocateCol( &lParse, col_cnt, status ) ) {
         ffcprs(&lParse);
         return( *status );
      }

      fits_iter_set_by_num( lParse.colData+col_cnt, outfptr,
                            colNo, 0, OutputCol );
      lParse.nCols++;

      for( i=0; i<nRngs; i++ ) {
         Info.dataPtr = NULL;
         Info.maxRows = end[i]-start[i]+1;

          /*
            If there is only 1 range, and it includes all the rows,
            and there are 10 or more rows, then set nPerLp = 0 so
            that the iterator function will dynamically choose the
            most efficient number of rows to process in each loop.
            Otherwise, set nPerLp to the number of rows in this range.
         */

         if( (Info.maxRows >= 10) && (nRngs == 1) &&
             (start[0] == 1) && (end[0] == totaln))
              nPerLp = 0;
         else
              nPerLp = Info.maxRows;

         if( ffiter( lParse.nCols, lParse.colData, start[i]-1,
                     nPerLp, fits_parser_workfn, (void*)&Info, status ) == -1 )
            *status = 0;
         else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }
         if( Info.anyNull ) anyNull = 1;
      }

      if( newNullKwd && !anyNull ) {
         ffdkey( outfptr, nullKwd, status );
      }

   } else {

      /* Put constant result into keyword */

      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE:
         ffukyd( outfptr, parName, result->value.data.dbl, 15,
                 parInfo, status );
         break;
      case TLONG:
         ffukyj( outfptr, parName, result->value.data.lng, parInfo, status );
         break;
      case TLOGICAL:
         ffukyl( outfptr, parName, result->value.data.log, parInfo, status );
         break;
      case TBIT:
      case TSTRING:
	 if (fits_strcasecmp(parName,"HISTORY") == 0) {
	   ffphis( outfptr, result->value.data.str, status);
	 } else if (fits_strcasecmp(parName,"COMMENT") == 0) {
	   ffpcom( outfptr, result->value.data.str, status);
	 } else {
	   ffukys( outfptr, parName, result->value.data.str, parInfo, status );
	 }
         break;
      }
   }

   ffcprs(&lParse);
   return( *status );
}